

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

CURLcode Curl_ssl_connect_nonblocking(connectdata *conn,int sockindex,_Bool *done)

{
  _Bool _Var1;
  CURLcode CVar2;
  
  if (((conn->bits).proxy_ssl_connected[sockindex] != true) ||
     (CVar2 = ssl_connect_init_proxy(conn,sockindex), CVar2 == CURLE_OK)) {
    _Var1 = ssl_prefs_check(conn->data);
    if (_Var1) {
      conn->ssl[sockindex].use = true;
      CVar2 = (*Curl_ssl->connect_nonblocking)(conn,sockindex,done);
      if ((CVar2 == CURLE_OK) && (CVar2 = CURLE_OK, *done == true)) {
        Curl_pgrsTime(conn->data,TIMER_APPCONNECT);
      }
    }
    else {
      CVar2 = CURLE_SSL_CONNECT_ERROR;
    }
  }
  return CVar2;
}

Assistant:

CURLcode
Curl_ssl_connect_nonblocking(struct connectdata *conn, int sockindex,
                             bool *done)
{
  CURLcode result;
  if(conn->bits.proxy_ssl_connected[sockindex]) {
    result = ssl_connect_init_proxy(conn, sockindex);
    if(result)
      return result;
  }

  if(!ssl_prefs_check(conn->data))
    return CURLE_SSL_CONNECT_ERROR;

  /* mark this is being ssl requested from here on. */
  conn->ssl[sockindex].use = TRUE;
  result = Curl_ssl->connect_nonblocking(conn, sockindex, done);
  if(!result && *done)
    Curl_pgrsTime(conn->data, TIMER_APPCONNECT); /* SSL is connected */
  return result;
}